

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::makeReturn(Builder *this,bool implicit,Id retVal)

{
  Block *pBVar1;
  Instruction *pIVar2;
  undefined7 in_register_00000031;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38 [3];
  pointer local_20;
  Instruction *inst;
  Id retVal_local;
  bool implicit_local;
  Builder *this_local;
  
  inst._0_4_ = retVal;
  inst._7_1_ = implicit;
  _retVal_local = this;
  if (retVal == 0) {
    pBVar1 = this->buildPoint;
    pIVar2 = (Instruction *)
             Instruction::operator_new((Instruction *)0x38,CONCAT71(in_register_00000031,implicit));
    Instruction::Instruction(pIVar2,0,0,OpReturn);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_40,
               pIVar2);
    Block::addInstruction(pBVar1,&local_40);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_40);
  }
  else {
    pIVar2 = (Instruction *)
             Instruction::operator_new((Instruction *)0x38,CONCAT71(in_register_00000031,implicit));
    Instruction::Instruction(pIVar2,0,0,OpReturnValue);
    local_20 = pIVar2;
    Instruction::addIdOperand(pIVar2,(Id)inst);
    pBVar1 = this->buildPoint;
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_38,
               local_20);
    Block::addInstruction(pBVar1,local_38);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_38)
    ;
  }
  if ((inst._7_1_ & 1) == 0) {
    createAndSetNoPredecessorBlock(this,"post-return");
  }
  return;
}

Assistant:

void Builder::makeReturn(bool implicit, Id retVal)
{
    if (retVal) {
        Instruction* inst = new Instruction(NoResult, NoType, OpReturnValue);
        inst->addIdOperand(retVal);
        buildPoint->addInstruction(std::unique_ptr<Instruction>(inst));
    } else
        buildPoint->addInstruction(std::unique_ptr<Instruction>(new Instruction(NoResult, NoType, OpReturn)));

    if (! implicit)
        createAndSetNoPredecessorBlock("post-return");
}